

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_fixupObjectFile
               (sysbvm_bytecodeJit_t *jit,sysbvm_elf64_header_t *header,
               sysbvm_elf64_header_t *headerExecutablePointer,uint8_t *instructionsExecutablePointer
               ,uint8_t *ehFramePointer,uint8_t *ehFrameExecutablePointer,
               uint8_t *debugLineExecutablePointer,uint8_t *debugStrExecutablePointer,
               uint8_t *debugAbbrevExecutablePointer,uint8_t *debugInfoExecutablePointer,
               uint8_t *objectFileContentExecutablePointer,sysbvm_jit_x64_elfContentFooter_t *footer
               )

{
  sysbvm_elf64_off_t contentOffset;
  int32_t *initialLocationExecutablePointer;
  int32_t *initialLocationPointer;
  uint8_t *ehFrameExecutablePointer_local;
  uint8_t *ehFramePointer_local;
  uint8_t *instructionsExecutablePointer_local;
  sysbvm_elf64_header_t *headerExecutablePointer_local;
  sysbvm_elf64_header_t *header_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  if ((jit->dwarfEhBuilder).fdeInitialLocationOffset != 0) {
    *(int *)(ehFramePointer + (jit->dwarfEhBuilder).fdeInitialLocationOffset) =
         (int)instructionsExecutablePointer -
         ((int)ehFrameExecutablePointer + (int)(jit->dwarfEhBuilder).fdeInitialLocationOffset);
  }
  header->sectionHeadersOffset = (long)footer + (0x60 - (long)header);
  (footer->sections).text.offset =
       (long)instructionsExecutablePointer - (long)headerExecutablePointer;
  (footer->sections).text.address = (sysbvm_elf64_addr_t)instructionsExecutablePointer;
  (footer->sections).text.size = (jit->instructions).size;
  (footer->sections).eh_frame.offset =
       (long)ehFrameExecutablePointer - (long)headerExecutablePointer;
  (footer->sections).eh_frame.address = (sysbvm_elf64_addr_t)ehFrameExecutablePointer;
  (footer->sections).eh_frame.size = (jit->dwarfEhBuilder).buffer.size;
  (footer->sections).debug_line.offset =
       (long)debugLineExecutablePointer - (long)headerExecutablePointer;
  (footer->sections).debug_line.size = (jit->dwarfDebugInfoBuilder).line.size;
  (footer->sections).debug_str.offset =
       (long)debugStrExecutablePointer - (long)headerExecutablePointer;
  (footer->sections).debug_str.size = (jit->dwarfDebugInfoBuilder).str.size;
  (footer->sections).debug_abbrev.offset =
       (long)debugAbbrevExecutablePointer - (long)headerExecutablePointer;
  (footer->sections).debug_abbrev.size = (jit->dwarfDebugInfoBuilder).abbrev.size;
  (footer->sections).debug_info.offset =
       (long)debugInfoExecutablePointer - (long)headerExecutablePointer;
  (footer->sections).debug_info.size = (jit->dwarfDebugInfoBuilder).info.size;
  (footer->sections).symtab.offset =
       (sysbvm_elf64_off_t)
       (objectFileContentExecutablePointer +
       ((footer->sections).symtab.offset - (long)headerExecutablePointer));
  (footer->sections).str.offset =
       (sysbvm_elf64_off_t)
       (objectFileContentExecutablePointer +
       ((footer->sections).str.offset - (long)headerExecutablePointer));
  (footer->sections).shstr.offset =
       (sysbvm_elf64_off_t)
       (objectFileContentExecutablePointer +
       ((footer->sections).shstr.offset - (long)headerExecutablePointer));
  return;
}

Assistant:

static void sysbvm_jit_fixupObjectFile(sysbvm_bytecodeJit_t *jit,
    sysbvm_elf64_header_t *header, sysbvm_elf64_header_t *headerExecutablePointer,
    uint8_t *instructionsExecutablePointer,
    uint8_t *ehFramePointer, uint8_t *ehFrameExecutablePointer,
    uint8_t *debugLineExecutablePointer,
    uint8_t *debugStrExecutablePointer,
    uint8_t *debugAbbrevExecutablePointer,
    uint8_t *debugInfoExecutablePointer,
    uint8_t *objectFileContentExecutablePointer,
    sysbvm_jit_x64_elfContentFooter_t *footer)
{
    if(jit->dwarfEhBuilder.fdeInitialLocationOffset > 0)
    {
        int32_t *initialLocationPointer = (int32_t*)(ehFramePointer + jit->dwarfEhBuilder.fdeInitialLocationOffset);
        int32_t *initialLocationExecutablePointer = (int32_t*)(ehFrameExecutablePointer + jit->dwarfEhBuilder.fdeInitialLocationOffset);
        *initialLocationPointer = (int32_t) ((uintptr_t)instructionsExecutablePointer - (uintptr_t)initialLocationExecutablePointer);
    }

    header->sectionHeadersOffset = (uintptr_t)&footer->sections - (uintptr_t)header;
    sysbvm_elf64_off_t contentOffset = (uintptr_t)objectFileContentExecutablePointer - (uintptr_t)headerExecutablePointer;

    footer->sections.text.offset = (uintptr_t)instructionsExecutablePointer - (uintptr_t)headerExecutablePointer;
    footer->sections.text.address = (sysbvm_elf64_addr_t)instructionsExecutablePointer;
    footer->sections.text.size = jit->instructions.size;

    footer->sections.eh_frame.offset = (uintptr_t)ehFrameExecutablePointer - (uintptr_t)headerExecutablePointer;
    footer->sections.eh_frame.address = (sysbvm_elf64_addr_t)ehFrameExecutablePointer;
    footer->sections.eh_frame.size = jit->dwarfEhBuilder.buffer.size;

    footer->sections.debug_line.offset = (uintptr_t)debugLineExecutablePointer - (uintptr_t)headerExecutablePointer;
    footer->sections.debug_line.size = jit->dwarfDebugInfoBuilder.line.size;

    footer->sections.debug_str.offset = (uintptr_t)debugStrExecutablePointer - (uintptr_t)headerExecutablePointer;
    footer->sections.debug_str.size = jit->dwarfDebugInfoBuilder.str.size;

    footer->sections.debug_abbrev.offset = (uintptr_t)debugAbbrevExecutablePointer - (uintptr_t)headerExecutablePointer;
    footer->sections.debug_abbrev.size = jit->dwarfDebugInfoBuilder.abbrev.size;

    footer->sections.debug_info.offset = (uintptr_t)debugInfoExecutablePointer - (uintptr_t)headerExecutablePointer;
    footer->sections.debug_info.size = jit->dwarfDebugInfoBuilder.info.size;

    footer->sections.symtab.offset += contentOffset;
    footer->sections.str.offset += contentOffset;
    footer->sections.shstr.offset += contentOffset;
}